

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall
flatbuffers::Parser::ParseEnumFromString(Parser *this,Type *type,string *result)

{
  uint uVar1;
  size_type sVar2;
  bool bVar3;
  char cVar4;
  long lVar5;
  const_iterator cVar6;
  long lVar7;
  EnumDef *pEVar8;
  string *in_RCX;
  string *psVar9;
  long lVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> enum_def_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> word;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> enum_val_str;
  string local_c0;
  key_type local_a0;
  Parser *local_80;
  ulong local_78;
  key_type local_70;
  ulong local_50;
  string *local_48;
  undefined8 local_40;
  string *local_38;
  
  psVar9 = (string *)((result->field_2)._M_allocated_capacity + 0xd0);
  if ((result->field_2)._M_allocated_capacity == 0) {
    psVar9 = result;
  }
  uVar1 = *(uint *)&(psVar9->_M_dataplus)._M_p;
  local_50 = (ulong)uVar1;
  local_38 = result;
  if (uVar1 - 1 < 10) {
    local_78 = 0;
    lVar5 = 0;
    local_80 = (Parser *)type;
    local_48 = in_RCX;
    do {
      lVar10 = lVar5;
      if (lVar10 == -1) break;
      lVar5 = std::__cxx11::string::find((char)&type[1].struct_def,0x20);
      lVar5 = lVar5 + 1;
      if (lVar5 == 0) {
        lVar5 = -1;
      }
      std::__cxx11::string::substr((ulong)&local_a0,(ulong)&type[1].struct_def);
      sVar2 = (local_38->field_2)._M_allocated_capacity;
      if (sVar2 == 0) {
        lVar7 = std::__cxx11::string::find((char)&local_a0,0x2e);
        if (lVar7 == -1) {
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,"enum values need to be qualified by an enum type","");
          Error(this,(string *)local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          cVar4 = '\0';
          lVar7 = 0;
        }
        else {
          std::__cxx11::string::substr((ulong)&local_c0,(ulong)&local_a0);
          pEVar8 = LookupEnum(local_80,&local_c0);
          local_40 = CONCAT71((int7)((ulong)pEVar8 >> 8),pEVar8 != (EnumDef *)0x0);
          if (pEVar8 == (EnumDef *)0x0) {
            std::operator+(&local_70,"unknown enum: ",&local_c0);
            Error(this,(string *)local_80);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            lVar7 = 0;
          }
          else {
            std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_a0);
            cVar6 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>_>
                            *)&pEVar8->vals,&local_70);
            if ((_Rb_tree_header *)cVar6._M_node ==
                &(pEVar8->vals).dict._M_t._M_impl.super__Rb_tree_header) {
              lVar7 = 0;
            }
            else {
              lVar7 = *(long *)(cVar6._M_node + 2);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          cVar4 = (char)local_40;
        }
        if (cVar4 != '\0') goto LAB_00114e65;
LAB_00114ebd:
        bVar3 = false;
      }
      else {
        cVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>_>
                        *)(sVar2 + 0xf0),&local_a0);
        if (cVar6._M_node == (_Base_ptr)(sVar2 + 0xf8)) {
          lVar7 = 0;
        }
        else {
          lVar7 = *(long *)(cVar6._M_node + 2);
        }
LAB_00114e65:
        if (lVar7 == 0) {
          std::operator+(&local_c0,"unknown enum value: ",&local_a0);
          Error(this,(string *)local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00114ebd;
        }
        local_78 = local_78 | *(ulong *)(lVar7 + 0xa0);
        bVar3 = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
    } while (bVar3);
    if (lVar10 == -1) {
      if (((uint)local_50 < 0xb) && ((0x552U >> ((uint)local_50 & 0x1f) & 1) != 0)) {
        NumToString<unsigned_long>(&local_a0,local_78);
      }
      else {
        NumToString<long>(&local_a0,local_78);
      }
      std::__cxx11::string::operator=(local_48,(string *)&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
    }
  }
  else {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"not a valid value for this field","");
    Error(this,(string *)type);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseEnumFromString(const Type &type,
                                         std::string *result) {
  const auto base_type =
      type.enum_def ? type.enum_def->underlying_type.base_type : type.base_type;
  if (!IsInteger(base_type)) return Error("not a valid value for this field");
  uint64_t u64 = 0;
  for (size_t pos = 0; pos != std::string::npos;) {
    const auto delim = attribute_.find_first_of(' ', pos);
    const auto last = (std::string::npos == delim);
    auto word = attribute_.substr(pos, !last ? delim - pos : std::string::npos);
    pos = !last ? delim + 1 : std::string::npos;
    const EnumVal *ev = nullptr;
    if (type.enum_def) {
      ev = type.enum_def->Lookup(word);
    } else {
      auto dot = word.find_first_of('.');
      if (std::string::npos == dot)
        return Error("enum values need to be qualified by an enum type");
      auto enum_def_str = word.substr(0, dot);
      const auto enum_def = LookupEnum(enum_def_str);
      if (!enum_def) return Error("unknown enum: " + enum_def_str);
      auto enum_val_str = word.substr(dot + 1);
      ev = enum_def->Lookup(enum_val_str);
    }
    if (!ev) return Error("unknown enum value: " + word);
    u64 |= ev->GetAsUInt64();
  }
  *result = IsUnsigned(base_type) ? NumToString(u64)
                                  : NumToString(static_cast<int64_t>(u64));
  return NoError();
}